

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

ASkyViewpoint * __thiscall TActorIterator<ASkyViewpoint>::Next(TActorIterator<ASkyViewpoint> *this)

{
  PClass *pPVar1;
  int iVar2;
  AActor *pAVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  bool bVar5;
  
  do {
    pAVar3 = FActorIterator::Next(&this->super_FActorIterator);
    pPVar1 = ASkyViewpoint::RegistrationInfo.MyClass;
    if (pAVar3 == (AActor *)0x0) {
      return (ASkyViewpoint *)0x0;
    }
    if ((pAVar3->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar2 = (**(pAVar3->super_DThinker).super_DObject._vptr_DObject)(pAVar3);
      (pAVar3->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
    }
    pPVar4 = (pAVar3->super_DThinker).super_DObject.Class;
    bVar5 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar1 && bVar5) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar1) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (bVar5) {
      return (ASkyViewpoint *)pAVar3;
    }
  } while( true );
}

Assistant:

T *Next ()
	{
		AActor *actor;
		do
		{
			actor = FActorIterator::Next ();
		} while (actor && !actor->IsKindOf (RUNTIME_TEMPLATE_CLASS(T)));
		return static_cast<T *>(actor);
	}